

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsnames.c
# Opt level: O0

FT_Error FT_Get_Sfnt_Name(FT_Face face,FT_UInt idx,FT_SfntName *aname)

{
  FT_Memory memory_00;
  FT_Stream stream_00;
  FT_UShort *pFVar1;
  FT_Pointer pvVar2;
  FT_Stream stream;
  FT_Memory memory;
  TT_Name entry;
  TT_Face_conflict ttface;
  FT_SfntName *pFStack_20;
  FT_Error error;
  FT_SfntName *aname_local;
  FT_Face pFStack_10;
  FT_UInt idx_local;
  FT_Face face_local;
  
  ttface._4_4_ = 6;
  if ((((aname != (FT_SfntName *)0x0) && (face != (FT_Face)0x0)) && ((face->face_flags & 8U) != 0))
     && (idx < *(ushort *)&face[2].available_sizes)) {
    pFVar1 = (FT_UShort *)((long)face[2].generic.data + (ulong)idx * 0x20);
    pFStack_20 = aname;
    if ((pFVar1[4] != 0) && (*(long *)(pFVar1 + 0xc) == 0)) {
      memory_00 = face->memory;
      stream_00 = face->stream;
      aname_local._4_4_ = idx;
      pFStack_10 = face;
      pvVar2 = ft_mem_qrealloc(memory_00,1,0,(ulong)pFVar1[4],(void *)0x0,
                               (FT_Error *)((long)&ttface + 4));
      *(FT_Pointer *)(pFVar1 + 0xc) = pvVar2;
      if ((ttface._4_4_ != 0) ||
         ((ttface._4_4_ = FT_Stream_Seek(stream_00,*(FT_ULong *)(pFVar1 + 8)), ttface._4_4_ != 0 ||
          (ttface._4_4_ = FT_Stream_Read(stream_00,*(FT_Byte **)(pFVar1 + 0xc),(ulong)pFVar1[4]),
          ttface._4_4_ != 0)))) {
        ft_mem_free(memory_00,*(void **)(pFVar1 + 0xc));
        pFVar1[0xc] = 0;
        pFVar1[0xd] = 0;
        pFVar1[0xe] = 0;
        pFVar1[0xf] = 0;
        pFVar1[4] = 0;
      }
    }
    pFStack_20->platform_id = *pFVar1;
    pFStack_20->encoding_id = pFVar1[1];
    pFStack_20->language_id = pFVar1[2];
    pFStack_20->name_id = pFVar1[3];
    pFStack_20->string = *(FT_Byte **)(pFVar1 + 0xc);
    pFStack_20->string_len = (uint)pFVar1[4];
    ttface._4_4_ = 0;
  }
  return ttface._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Sfnt_Name( FT_Face       face,
                    FT_UInt       idx,
                    FT_SfntName  *aname )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );


    if ( aname && face && FT_IS_SFNT( face ) )
    {
      TT_Face  ttface = (TT_Face)face;


      if ( idx < (FT_UInt)ttface->num_names )
      {
        TT_Name  entry = ttface->name_table.names + idx;


        /* load name on demand */
        if ( entry->stringLength > 0 && !entry->string )
        {
          FT_Memory  memory = face->memory;
          FT_Stream  stream = face->stream;


          if ( FT_QNEW_ARRAY ( entry->string, entry->stringLength ) ||
               FT_STREAM_SEEK( entry->stringOffset )                ||
               FT_STREAM_READ( entry->string, entry->stringLength ) )
          {
            FT_FREE( entry->string );
            entry->stringLength = 0;
          }
        }

        aname->platform_id = entry->platformID;
        aname->encoding_id = entry->encodingID;
        aname->language_id = entry->languageID;
        aname->name_id     = entry->nameID;
        aname->string      = (FT_Byte*)entry->string;
        aname->string_len  = entry->stringLength;

        error = FT_Err_Ok;
      }
    }

    return error;
  }